

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.h
# Opt level: O1

void __thiscall
slang::syntax::SeparatedSyntaxList<slang::syntax::PropertyExprSyntax>::resetAll
          (SeparatedSyntaxList<slang::syntax::PropertyExprSyntax> *this,BumpAllocator *alloc,
          span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL> children)

{
  int iVar1;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> buffer;
  SmallVector<slang::syntax::TokenOrSyntax,_2UL> local_70;
  
  SmallVector<slang::syntax::TokenOrSyntax,_2UL>::SmallVector
            (&local_70,children._M_extent._M_extent_value._M_extent_value);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::
  append<__gnu_cxx::__normal_iterator<const_slang::syntax::TokenOrSyntax_*,_std::span<const_slang::syntax::TokenOrSyntax,_18446744073709551615UL>_>_>
            (&local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,children._M_ptr,
             children._M_ptr + children._M_extent._M_extent_value._M_extent_value);
  iVar1 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)alloc,src);
  (this->elements)._M_ptr = (pointer)CONCAT44(extraout_var,iVar1);
  (this->elements)._M_extent._M_extent_value = extraout_RDX;
  (this->super_SyntaxListBase).childCount =
       local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len;
  if (local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ !=
      (pointer)local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement) {
    operator_delete(local_70.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_);
  }
  return;
}

Assistant:

void resetAll(BumpAllocator& alloc, std::span<const TokenOrSyntax> children) final {
        SmallVector<TokenOrSyntax> buffer(children.size(), UninitializedTag());
        buffer.append_range(children);

        elements = buffer.copy(alloc);
        childCount = buffer.size();
    }